

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeInt::ParseNodeInt(ParseNodeInt *this,charcount_t ichMin,charcount_t ichLim,int32 lw)

{
  int32 lw_local;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  ParseNodeInt *this_local;
  
  ParseNode::ParseNode(&this->super_ParseNode,knopInt,ichMin,ichLim);
  this->lw = lw;
  return;
}

Assistant:

ParseNodeInt::ParseNodeInt(charcount_t ichMin, charcount_t ichLim, int32 lw)
    : ParseNode(knopInt, ichMin, ichLim)
{
    this->lw = lw;
}